

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_MergeSort(int *pInput,int nSize)

{
  int *pOutBeg;
  int *pOutput;
  int nSize_local;
  int *pInput_local;
  
  if (1 < nSize) {
    pOutBeg = (int *)malloc((long)nSize << 2);
    Abc_Sort_rec(pInput,pInput + nSize,pOutBeg);
    free(pOutBeg);
  }
  return;
}

Assistant:

void Abc_MergeSort( int * pInput, int nSize )
{
    int * pOutput;
    if ( nSize < 2 )
        return;
    pOutput = (int *) malloc( sizeof(int) * nSize );
    Abc_Sort_rec( pInput, pInput + nSize, pOutput );
    free( pOutput );
}